

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_t * new_instance(ptls_context_t *ctx,int is_server)

{
  byte in_SIL;
  long in_RDI;
  ptls_t *tls;
  ssize_t in_stack_fffffffffffffdd8;
  ptls_t *__dest;
  ptls_context_t *in_stack_fffffffffffffde0;
  ptls_t *local_8;
  
  if (*(long *)(in_RDI + 8) == 0) {
    __assert_fail("ctx->get_time != NULL && \"please set ctx->get_time to `&ptls_get_time`; see #92\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x10ea,"ptls_t *new_instance(ptls_context_t *, int)");
  }
  local_8 = (ptls_t *)malloc(0x200);
  if (local_8 == (ptls_t *)0x0) {
    local_8 = (ptls_t *)0x0;
  }
  else {
    update_open_count(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    __dest = local_8;
    memset(&stack0xfffffffffffffde0,0,0x200);
    memcpy(__dest,&stack0xfffffffffffffde0,0x200);
    local_8->field_0x160 = local_8->field_0x160 & 0xfe | in_SIL & 1;
    local_8->field_0x160 = local_8->field_0x160 & 0xfb | (*(byte *)(in_RDI + 0x70) >> 2 & 1) << 2;
    local_8->field_0x160 = local_8->field_0x160 & 0xdf;
  }
  return local_8;
}

Assistant:

static ptls_t *new_instance(ptls_context_t *ctx, int is_server)
{
    ptls_t *tls;

    assert(ctx->get_time != NULL && "please set ctx->get_time to `&ptls_get_time`; see #92");

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    update_open_count(ctx, 1);
    *tls = (ptls_t){ctx};
    tls->is_server = is_server;
    tls->send_change_cipher_spec = ctx->send_change_cipher_spec;
    tls->skip_tracing = ptls_default_skip_tracing;
    return tls;
}